

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O2

void TrackUsedInit(Disk *disk)

{
  pointer puVar1;
  byte bVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  ushort uVar6;
  int iVar7;
  Data *pDVar8;
  ulong uVar9;
  exception *peVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  byte bVar14;
  long lVar15;
  size_t i;
  int entry;
  ulong uVar16;
  byte local_172;
  byte local_171;
  Sector *sector;
  uint local_164;
  ulong local_160;
  Disk *local_158;
  ulong local_150;
  ulong local_148;
  MGT_DISK_INFO di;
  Header local_110;
  CylHead cylhead;
  uint8_t abBAM [195];
  
  memset(abBAM,0,0xc3);
  adwUsed[0][2] = 0;
  adwUsed[1][0] = 0;
  adwUsed[1][1] = 0;
  adwUsed[1][2] = 0;
  adwUsed[0][0] = 0x11;
  adwUsed[0][1] = 0;
  sector = (Sector *)0x0;
  Header::Header((Header *)&di,0,0,1,2);
  local_158 = disk;
  bVar4 = Disk::find(disk,(Header *)&di,&sector);
  if (bVar4) {
    iVar7 = Sector::data_size(sector);
    if (0x1ff < iVar7) {
      di.dos_type = SAMDOS;
      di.dir_tracks = 4;
      di.disk_label._M_dataplus._M_p = (pointer)&di.disk_label.field_2;
      di.disk_label._M_string_length = 0;
      di.disk_label.field_2._M_local_buf[0] = '\0';
      di.serial_number = 0;
      pDVar8 = Sector::data_copy(sector,0);
      GetDiskInfo((pDVar8->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start,&di);
      uVar16 = 0;
      bVar4 = false;
      do {
        local_171 = (byte)uVar16;
        if ((bVar4) || (uVar13 = uVar16 & 0xff, di.dir_tracks <= (int)uVar13)) {
          for (uVar16 = 0; uVar16 != 0x618; uVar16 = uVar16 + 1) {
            if ((abBAM[uVar16 >> 3] >> ((uint)uVar16 & 7) & 1) != 0) {
              uVar6 = (ushort)uVar16 / 10 + 4;
              uVar11 = uVar6 - 0x50;
              if (0x2f7 >= uVar16) {
                uVar11 = (uint)uVar6;
              }
              adwUsed[0x2f7 < uVar16][uVar11 >> 5] =
                   adwUsed[0x2f7 < uVar16][uVar11 >> 5] | 1 << ((byte)uVar11 & 0x1f);
            }
          }
          std::__cxx11::string::~string((string *)&di.disk_label);
          return;
        }
        bVar2 = local_171 & 0x1f;
        uVar11 = (int)uVar13 + 1;
        local_164 = 1 << ((byte)uVar11 & 0x1f);
        local_148 = (ulong)(uVar11 >> 5);
        bVar14 = 1;
        uVar9 = uVar16 & 0xffffffff;
        local_160 = uVar13;
        local_150 = uVar16;
        while( true ) {
          local_172 = bVar14;
          if ((bVar4) || (10 < bVar14)) break;
          uVar3 = 4;
          if (bVar14 != 1 || (char)uVar9 != '\x04') {
            CylHead::CylHead(&cylhead,(uint)uVar9 & 0xff,0);
            Header::Header(&local_110,(int)local_160,0,(uint)bVar14,2);
            bVar5 = Disk::find(local_158,&local_110,&sector);
            if (!bVar5) {
LAB_0017c7f2:
              peVar10 = (exception *)__cxa_allocate_exception(0x10);
              util::exception::
              exception<char_const(&)[5],unsigned_char&,char_const(&)[16],unsigned_char&,char_const(&)[11]>
                        (peVar10,(char (*) [5])"cyl ",&local_171,(char (*) [16])" head 0 sector ",
                         &local_172,(char (*) [11])0x1ab5fa);
              __cxa_throw(peVar10,&util::exception::typeinfo,std::runtime_error::~runtime_error);
            }
            iVar7 = Sector::data_size(sector);
            if (iVar7 < 0x200) goto LAB_0017c7f2;
            lVar15 = 0xf;
            for (uVar16 = 0; (!bVar4 && (uVar16 < 2)); uVar16 = uVar16 + 1) {
              pDVar8 = Sector::data_copy(sector,0);
              puVar1 = (pDVar8->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
              if ((puVar1[uVar16 * 0x100] & 0x3f) == 0) {
                bVar4 = puVar1[uVar16 * 0x100 + 1] == '\0';
              }
              else {
                adwUsed[0][uVar13 >> 5] = adwUsed[0][uVar13 >> 5] | 1 << bVar2;
                if ((uVar16 == 1 && bVar14 == 9) && (di.dir_tracks + -1 != (int)local_160)) {
                  adwUsed[0][local_148] = adwUsed[0][local_148] | local_164;
                }
                for (lVar12 = 0; lVar12 != 0xc3; lVar12 = lVar12 + 1) {
                  abBAM[lVar12] = abBAM[lVar12] | puVar1[lVar12 + lVar15];
                }
              }
              lVar15 = lVar15 + 0x100;
            }
            uVar3 = local_150 & 0xffffffff;
            uVar16 = local_150;
          }
          uVar9 = uVar3;
          bVar14 = bVar14 + 1;
        }
        uVar16 = CONCAT71((int7)(uVar16 >> 8),(char)uVar16 + '\x01');
      } while( true );
    }
  }
  peVar10 = (exception *)__cxa_allocate_exception(0x10);
  util::exception::exception<char_const(&)[23]>(peVar10,(char (*) [23])"disk is not MGT format");
  __cxa_throw(peVar10,&util::exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void TrackUsedInit(Disk& disk)
{
    bool fDone = false;
    uint8_t abBAM[195] = {};

    // Tracks 0 and 4 cover the (empty) directory start and boot sector, and are always used
    memset(&adwUsed, 0, sizeof(adwUsed));
    adwUsed[0][0] |= 0x00000011;

    const Sector* sector = nullptr;
    if (!disk.find(Header(0, 0, 1, 2), sector) || sector->data_size() < SECTOR_SIZE)
        throw util::exception("disk is not MGT format");

    MGT_DISK_INFO di;
    const Data& data1 = sector->data_copy();
    GetDiskInfo(data1.data(), di);

    for (uint8_t cyl = 0; !fDone && cyl < di.dir_tracks; ++cyl)
    {
        for (uint8_t sec = 1; !fDone && sec <= MGT_SECTORS; ++sec)
        {
            // Skip the boot sector on MasterDOS extended directories
            if (cyl == 4 && sec == 1)
                continue;

            CylHead cylhead(cyl, 0);
            if (!disk.find(Header(cyl, 0, sec, 2), sector) || sector->data_size() < SECTOR_SIZE)
                throw util::exception("cyl ", cyl, " head 0 sector ", sec, " not found");

            for (int entry = 0; !fDone && entry < 2; ++entry)
            {
                const Data& data = sector->data_copy();
                const MGT_DIR* pdi = reinterpret_cast<const MGT_DIR*>(data.data() + ((SECTOR_SIZE / 2) * entry));

                if (pdi->bType & 0x3f)
                {
                    // Mark the current track as used
                    adwUsed[0][cyl >> 5] |= (1 << (cyl & 0x1f));

                    // If the final entry of the non-final track is in use, ensure the next track is considered used
                    if (entry == 1 && sec == (MGT_SECTORS - 1) && cyl != (di.dir_tracks - 1))
                        adwUsed[0][(cyl + 1) >> 5] |= (1 << ((cyl + 1) & 0x1f));

                    // Merge the sector address map into the overall disk BAM
                    for (size_t i = 0; i < sizeof(abBAM); ++i)
                        abBAM[i] |= pdi->abSectorMap[i];
                }
                else
                    fDone = !pdi->abName[0];
            }
        }
    }

    // Convert the BAM used sectors to our used tracks
    for (size_t i = 0; i < (sizeof(abBAM) << 3); ++i)
    {
        // Sector in use?
        if (abBAM[i >> 3] & (1 << (i & 7)))
        {
            uint8_t cyl = static_cast<uint8_t>((i / MGT_SECTORS) + MGT_DIR_TRACKS);
            uint8_t head = cyl / NORMAL_TRACKS;

            cyl %= NORMAL_TRACKS;
            adwUsed[head][cyl >> 5] |= (1 << (cyl & 0x1f));
        }
    }
}